

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.c
# Opt level: O3

LClosure * luaU_undump(lua_State *L,ZIO *Z,char *name)

{
  char cVar1;
  StkId pTVar2;
  LClosure *pLVar3;
  Proto *f;
  char *pcVar4;
  lu_byte x;
  byte local_40;
  undefined7 uStack_3f;
  LoadState local_38;
  
  cVar1 = *name;
  if (cVar1 == '\x1b') {
    name = "binary string";
  }
  else if ((cVar1 == '@') || (cVar1 == '=')) {
    name = name + 1;
  }
  local_38.L = L;
  local_38.Z = Z;
  local_38.name = name;
  checkliteral(&local_38,"Ravi","not a");
  LoadBlock(&local_38,&local_40,1);
  if (local_40 == 0x53) {
    LoadBlock(&local_38,&local_40,1);
    local_38.version = local_40;
    if (local_40 < 2) {
      checkliteral(&local_38,anon_var_dwarf_11e77,"corrupted");
      fchecksize(&local_38,4,"int");
      fchecksize(&local_38,8,"size_t");
      fchecksize(&local_38,4,"Instruction");
      fchecksize(&local_38,8,"lua_Integer");
      fchecksize(&local_38,8,"lua_Number");
      LoadBlock(&local_38,&local_40,8);
      if (CONCAT71(uStack_3f,local_40) == 0x5678) {
        LoadBlock(&local_38,&local_40,8);
        if (((double)CONCAT71(uStack_3f,local_40) == 370.5) &&
           (!NAN((double)CONCAT71(uStack_3f,local_40)))) {
          LoadBlock(&local_38,&local_40,1);
          pLVar3 = luaF_newLclosure(L,(uint)local_40);
          if ((pLVar3->tt & 0xe) < 10) {
            pTVar2 = L->top;
            (pTVar2->value_).gc = (GCObject *)pLVar3;
            pTVar2->tt_ = 0x8006;
            if ((pLVar3->tt == '\x06') && ((pLVar3->marked & (L->l_G->currentwhite ^ 0x18)) == 0)) {
              luaD_inctop(L);
              f = luaF_newproto(L);
              pLVar3->p = f;
              LoadFunction(&local_38,f,(TString *)0x0);
              if (pLVar3->p->sizeupvalues == (uint)pLVar3->nupvalues) {
                return pLVar3;
              }
              __assert_fail("cl->nupvalues == cl->p->sizeupvalues",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                            ,0x134,"LClosure *luaU_undump(lua_State *, ZIO *, const char *)");
            }
            pcVar4 = "0";
          }
          else {
            pcVar4 = "(((x_)->tt) & 0x0F) < (9+1)";
          }
          __assert_fail(pcVar4,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lundump.c"
                        ,0x130,"LClosure *luaU_undump(lua_State *, ZIO *, const char *)");
        }
        pcVar4 = "float format mismatch in";
      }
      else {
        pcVar4 = "endianness mismatch in";
      }
    }
    else {
      pcVar4 = "format mismatch in";
    }
  }
  else {
    pcVar4 = "version mismatch in";
  }
  error(&local_38,pcVar4);
}

Assistant:

LClosure *luaU_undump(lua_State *L, ZIO *Z, const char *name) {
  LoadState S;
  LClosure *cl;
  if (*name == '@' || *name == '=')
    S.name = name + 1;
  else if (*name == LUA_SIGNATURE[0])
    S.name = "binary string";
  else
    S.name = name;
  S.L = L;
  S.Z = Z;
  checkHeader(&S);
  cl = luaF_newLclosure(L, LoadByte(&S));
  setclLvalue(L, L->top, cl);
  luaD_inctop(L);
  cl->p = luaF_newproto(L);
  LoadFunction(&S, cl->p, NULL);
  lua_assert(cl->nupvalues == cl->p->sizeupvalues);
  luai_verifycode(L, buff, cl->p);
  return cl;
}